

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_simplify_intsubsub_leftcancel(jit_State *J)

{
  TRef TVar1;
  
  TVar1 = 0;
  if (((((J->fold).ins.field_1.t.irt & 0x1f) != 0xe) &&
      (TVar1 = 0, ((J->fold).left.field_1.t.irt & 0x40) == 0)) &&
     (TVar1 = 0, (J->fold).ins.field_0.op2 == (J->fold).left.field_0.op1)) {
    TVar1 = lj_ir_kint(J,0);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (J->fold).left.field_0.op2;
    TVar1 = 1;
  }
  return TVar1;
}

Assistant:

LJFOLD(SUB SUB any)
LJFOLDF(simplify_intsubsub_leftcancel)
{
  if (!irt_isnum(fins->t)) {
    PHIBARRIER(fleft);
    if (fins->op2 == fleft->op1) {  /* (i - j) - i ==> 0 - j */
      fins->op1 = (IRRef1)lj_ir_kint(J, 0);
      fins->op2 = fleft->op2;
      return RETRYFOLD;
    }
  }
  return NEXTFOLD;
}